

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_DeletionMarkers2::_Run(_Test_DeletionMarkers2 *this)

{
  DBImpl *pDVar1;
  Slice local_10f0;
  undefined1 local_10e0 [448];
  Slice local_f20;
  undefined1 local_f10 [448];
  Slice local_d50;
  undefined1 local_d40 [448];
  undefined1 local_b80 [424];
  Slice local_9d8;
  undefined1 local_9c8 [455];
  allocator local_801;
  string local_800 [32];
  undefined1 local_7e0 [432];
  int local_630;
  int local_62c;
  Tester local_628;
  undefined1 local_488 [16];
  string local_478 [39];
  allocator local_451;
  string local_450 [32];
  undefined1 local_430 [16];
  string local_420 [39];
  allocator local_3f9;
  string local_3f8 [32];
  undefined1 local_3d8 [436];
  undefined4 local_224;
  undefined1 local_220 [4];
  int last;
  Tester local_218;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  undefined1 local_18 [16];
  _Test_DeletionMarkers2 *this_local;
  
  local_18._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"foo",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"v1",&local_71);
  DBTest::Put((DBTest *)local_18,(string *)this,(string *)local_38);
  Status::~Status((Status *)local_18);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x56a);
  DBTest::dbfull(&this->super_DBTest);
  DBImpl::TEST_CompactMemTable((DBImpl *)local_220);
  test::Tester::IsOk(&local_218,(Status *)local_220);
  Status::~Status((Status *)local_220);
  test::Tester::~Tester(&local_218);
  local_224 = 2;
  test::Tester::Tester
            ((Tester *)(local_3d8 + 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x56c);
  local_3d8._12_4_ = DBTest::NumTableFilesAtLevel(&this->super_DBTest,2);
  local_3d8._8_4_ = 1;
  test::Tester::IsEq<int,int>
            ((Tester *)(local_3d8 + 0x10),(int *)(local_3d8 + 0xc),(int *)(local_3d8 + 8));
  test::Tester::~Tester((Tester *)(local_3d8 + 0x10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"a",&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"begin",(allocator *)(local_430 + 0xf));
  DBTest::Put((DBTest *)local_3d8,(string *)this,(string *)local_3f8);
  Status::~Status((Status *)local_3d8);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)(local_430 + 0xf));
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"z",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"end",(allocator *)(local_488 + 0xf));
  DBTest::Put((DBTest *)local_430,(string *)this,(string *)local_450);
  Status::~Status((Status *)local_430);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)(local_488 + 0xf));
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  DBTest::dbfull(&this->super_DBTest);
  DBImpl::TEST_CompactMemTable((DBImpl *)local_488);
  Status::~Status((Status *)local_488);
  test::Tester::Tester
            (&local_628,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x572);
  local_62c = DBTest::NumTableFilesAtLevel(&this->super_DBTest,2);
  local_630 = 1;
  test::Tester::IsEq<int,int>(&local_628,&local_62c,&local_630);
  test::Tester::~Tester(&local_628);
  test::Tester::Tester
            ((Tester *)(local_7e0 + 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x573);
  local_7e0._12_4_ = DBTest::NumTableFilesAtLevel(&this->super_DBTest,1);
  local_7e0._8_4_ = 1;
  test::Tester::IsEq<int,int>
            ((Tester *)(local_7e0 + 0x10),(int *)(local_7e0 + 0xc),(int *)(local_7e0 + 8));
  test::Tester::~Tester((Tester *)(local_7e0 + 0x10));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_800,"foo",&local_801);
  DBTest::Delete((DBTest *)local_7e0,(string *)this);
  Status::~Status((Status *)local_7e0);
  std::__cxx11::string::~string(local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  test::Tester::Tester
            ((Tester *)(local_9c8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x576);
  Slice::Slice(&local_9d8,"foo");
  DBTest::AllEntriesFor_abi_cxx11_((DBTest *)local_9c8,(Slice *)this);
  test::Tester::IsEq<std::__cxx11::string,char[12]>
            ((Tester *)(local_9c8 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9c8,
             (char (*) [12])"[ DEL, v1 ]");
  std::__cxx11::string::~string((string *)local_9c8);
  test::Tester::~Tester((Tester *)(local_9c8 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_b80 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x577);
  DBTest::dbfull(&this->super_DBTest);
  DBImpl::TEST_CompactMemTable((DBImpl *)local_b80);
  test::Tester::IsOk((Tester *)(local_b80 + 8),(Status *)local_b80);
  Status::~Status((Status *)local_b80);
  test::Tester::~Tester((Tester *)(local_b80 + 8));
  test::Tester::Tester
            ((Tester *)(local_d40 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x578);
  Slice::Slice(&local_d50,"foo");
  DBTest::AllEntriesFor_abi_cxx11_((DBTest *)local_d40,(Slice *)this);
  test::Tester::IsEq<std::__cxx11::string,char[12]>
            ((Tester *)(local_d40 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d40,
             (char (*) [12])"[ DEL, v1 ]");
  std::__cxx11::string::~string((string *)local_d40);
  test::Tester::~Tester((Tester *)(local_d40 + 0x20));
  pDVar1 = DBTest::dbfull(&this->super_DBTest);
  DBImpl::TEST_CompactRange(pDVar1,0,(Slice *)0x0,(Slice *)0x0);
  test::Tester::Tester
            ((Tester *)(local_f10 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x57b);
  Slice::Slice(&local_f20,"foo");
  DBTest::AllEntriesFor_abi_cxx11_((DBTest *)local_f10,(Slice *)this);
  test::Tester::IsEq<std::__cxx11::string,char[12]>
            ((Tester *)(local_f10 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f10,
             (char (*) [12])"[ DEL, v1 ]");
  std::__cxx11::string::~string((string *)local_f10);
  test::Tester::~Tester((Tester *)(local_f10 + 0x20));
  pDVar1 = DBTest::dbfull(&this->super_DBTest);
  DBImpl::TEST_CompactRange(pDVar1,1,(Slice *)0x0,(Slice *)0x0);
  test::Tester::Tester
            ((Tester *)(local_10e0 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x57f);
  Slice::Slice(&local_10f0,"foo");
  DBTest::AllEntriesFor_abi_cxx11_((DBTest *)local_10e0,(Slice *)this);
  test::Tester::IsEq<std::__cxx11::string,char[4]>
            ((Tester *)(local_10e0 + 0x20),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10e0,
             (char (*) [4])"[ ]");
  std::__cxx11::string::~string((string *)local_10e0);
  test::Tester::~Tester((Tester *)(local_10e0 + 0x20));
  return;
}

Assistant:

TEST(DBTest, DeletionMarkers2) {
  Put("foo", "v1");
  ASSERT_OK(dbfull()->TEST_CompactMemTable());
  const int last = config::kMaxMemCompactLevel;
  ASSERT_EQ(NumTableFilesAtLevel(last), 1);  // foo => v1 is now in last level

  // Place a table at level last-1 to prevent merging with preceding mutation
  Put("a", "begin");
  Put("z", "end");
  dbfull()->TEST_CompactMemTable();
  ASSERT_EQ(NumTableFilesAtLevel(last), 1);
  ASSERT_EQ(NumTableFilesAtLevel(last - 1), 1);

  Delete("foo");
  ASSERT_EQ(AllEntriesFor("foo"), "[ DEL, v1 ]");
  ASSERT_OK(dbfull()->TEST_CompactMemTable());  // Moves to level last-2
  ASSERT_EQ(AllEntriesFor("foo"), "[ DEL, v1 ]");
  dbfull()->TEST_CompactRange(last - 2, nullptr, nullptr);
  // DEL kept: "last" file overlaps
  ASSERT_EQ(AllEntriesFor("foo"), "[ DEL, v1 ]");
  dbfull()->TEST_CompactRange(last - 1, nullptr, nullptr);
  // Merging last-1 w/ last, so we are the base level for "foo", so
  // DEL is removed.  (as is v1).
  ASSERT_EQ(AllEntriesFor("foo"), "[ ]");
}